

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O0

char * __thiscall
Memory::PageSegmentBase<Memory::VirtualAllocWrapper>::AllocPages<false>
          (PageSegmentBase<Memory::VirtualAllocWrapper> *this,uint pageCount)

{
  HANDLE pVVar1;
  code *pcVar2;
  bool bVar3;
  BOOLEAN BVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  BOOL BVar8;
  undefined4 *puVar9;
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  *pPVar10;
  HANDLE pVVar11;
  DWORD local_30;
  BOOL vpresult;
  DWORD oldProtect;
  uint nextIndex;
  char *allocAddress;
  uint index;
  uint pageCount_local;
  PageSegmentBase<Memory::VirtualAllocWrapper> *this_local;
  
  allocAddress._4_4_ = pageCount;
  _index = this;
  if (this->freePageCount == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x152,"(freePageCount != 0)","freePageCount != 0");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  uVar6 = this->freePageCount;
  uVar5 = GetCountOfFreePages(this);
  if (uVar6 != uVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x153,"(freePageCount == (uint)this->GetCountOfFreePages())",
                       "freePageCount == (uint)this->GetCountOfFreePages()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  if (allocAddress._4_4_ <= this->freePageCount) {
    bVar3 = IsFull(this);
    if (bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0x158,"(!IsFull())","!IsFull()");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    allocAddress._0_4_ = GetNextBitInFreePagesBitVector(this,0);
    while (uVar7 = (uint)allocAddress, (uint)allocAddress != 0xffffffff) {
      pPVar10 = SegmentBase<Memory::VirtualAllocWrapper>::GetAllocator
                          (&this->super_SegmentBase<Memory::VirtualAllocWrapper>);
      uVar6 = PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
              ::GetMaxAllocPageCount(pPVar10);
      if (uVar6 <= uVar7) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                           ,0x15d,"(index < this->GetAllocator()->GetMaxAllocPageCount())",
                           "index < this->GetAllocator()->GetMaxAllocPageCount()");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
      uVar6 = GetAvailablePageCount(this);
      if (uVar6 - (uint)allocAddress < allocAddress._4_4_) {
        return (char *)0x0;
      }
      if ((allocAddress._4_4_ == 1) ||
         (BVar4 = TestRangeInFreePagesBitVector(this,(uint)allocAddress,allocAddress._4_4_),
         BVar4 != '\0')) {
        _oldProtect = (this->super_SegmentBase<Memory::VirtualAllocWrapper>).address +
                      ((uint)allocAddress << 0xc);
        if (allocAddress._4_4_ < 2) {
LAB_00990ef6:
          ClearRangeInFreePagesBitVector(this,(uint)allocAddress,allocAddress._4_4_);
          this->freePageCount = this->freePageCount - allocAddress._4_4_;
          uVar6 = this->freePageCount;
          uVar5 = GetCountOfFreePages(this);
          if (uVar6 != uVar5) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar9 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                               ,0x177,"(freePageCount == (uint)this->GetCountOfFreePages())",
                               "freePageCount == (uint)this->GetCountOfFreePages()");
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar9 = 0;
          }
          pPVar10 = SegmentBase<Memory::VirtualAllocWrapper>::GetAllocator
                              (&this->super_SegmentBase<Memory::VirtualAllocWrapper>);
          pVVar1 = pPVar10->processHandle;
          pVVar11 = GetCurrentProcess();
          if (pVVar1 == pVVar11) {
            BVar8 = VirtualProtect(_oldProtect,(ulong)(allocAddress._4_4_ << 0xc),4,&local_30);
            if (BVar8 == 0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar9 = 1;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                                 ,0x180,"((0))","UNREACHED");
              if (bVar3) {
                puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar9 = 0;
                return (char *)0x0;
              }
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            if (local_30 != 1) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar9 = 1;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                                 ,0x183,"(oldProtect == 0x01)","oldProtect == PAGE_NOACCESS");
              if (!bVar3) {
                pcVar2 = (code *)invalidInstructionException();
                (*pcVar2)();
              }
              puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar9 = 0;
            }
          }
          return _oldProtect;
        }
        vpresult = 0;
        bVar3 = IsAllocationPageAligned(_oldProtect,(ulong)allocAddress._4_4_,(uint *)&vpresult);
        if (bVar3) goto LAB_00990ef6;
        uVar7 = (uint)allocAddress + vpresult;
        pPVar10 = SegmentBase<Memory::VirtualAllocWrapper>::GetAllocator
                            (&this->super_SegmentBase<Memory::VirtualAllocWrapper>);
        uVar6 = PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                ::GetMaxAllocPageCount(pPVar10);
        if (uVar6 <= uVar7) {
          return (char *)0x0;
        }
        allocAddress._0_4_ =
             BVStatic<272UL>::GetNextBit(&this->freePages,(uint)allocAddress + vpresult);
      }
      else {
        allocAddress._0_4_ = GetNextBitInFreePagesBitVector(this,(uint)allocAddress + 1);
      }
    }
  }
  return (char *)0x0;
}

Assistant:

char *
PageSegmentBase<T>::AllocPages(uint pageCount)
{
    Assert(freePageCount != 0);
    Assert(freePageCount == (uint)this->GetCountOfFreePages());
    if (freePageCount < pageCount)
    {
        return nullptr;
    }
    Assert(!IsFull());

    uint index = this->GetNextBitInFreePagesBitVector(0);
    while (index != -1)
    {
        Assert(index < this->GetAllocator()->GetMaxAllocPageCount());

        if (GetAvailablePageCount() - index < pageCount)
        {
            break;
        }
        if (pageCount == 1 || this->TestRangeInFreePagesBitVector(index, pageCount))
        {
            char * allocAddress = this->address + index * AutoSystemInfo::PageSize;

            if (pageCount > 1 && !notPageAligned)
            {
                uint nextIndex = 0;
                if (!IsAllocationPageAligned(allocAddress, pageCount, &nextIndex))
                {
                    if (index + nextIndex >= this->GetAllocator()->GetMaxAllocPageCount())
                    {
                        return nullptr;
                    }
                    index = this->freePages.GetNextBit(index + nextIndex);
                    continue;
                }
            }

            this->ClearRangeInFreePagesBitVector(index, pageCount);
            freePageCount -= pageCount;
            Assert(freePageCount == (uint)this->GetCountOfFreePages());

#ifdef PAGEALLOCATOR_PROTECT_FREEPAGE
            if (this->GetAllocator()->processHandle == GetCurrentProcess())
            {
                DWORD oldProtect;
                BOOL vpresult = VirtualProtect(allocAddress, pageCount * AutoSystemInfo::PageSize, PAGE_READWRITE, &oldProtect);
                if (vpresult == FALSE)
                {
                    Assert(UNREACHED);
                    return nullptr;
                }
                Assert(oldProtect == PAGE_NOACCESS);
            }
#endif
            return allocAddress;
        }
        index = this->GetNextBitInFreePagesBitVector(index + 1);
    }
    return nullptr;
}